

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_constrain(REF_GRID ref_grid,REF_INT node)

{
  REF_DBL t;
  int iVar1;
  REF_GEOM pRVar2;
  REF_ADJ pRVar3;
  REF_NODE pRVar4;
  REF_ADJ_ITEM pRVar5;
  REF_INT *pRVar6;
  REF_CELL ref_cell;
  REF_ADJ pRVar7;
  bool bVar8;
  uint uVar9;
  REF_INT RVar10;
  uint uVar11;
  REF_INT RVar12;
  ulong uVar13;
  long lVar14;
  REF_DBL *pRVar15;
  undefined8 uVar16;
  ulong uVar17;
  char *pcVar18;
  bool bVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  REF_DBL xyz [3];
  int local_cc;
  double edgeuv [2];
  double uv [2];
  REF_INT nodes [27];
  
  uVar11 = 0;
  if (-1 < node) {
    pRVar2 = ref_grid->geom;
    pRVar3 = pRVar2->ref_adj;
    if (node < pRVar3->nnode) {
      uVar9 = pRVar3->first[(uint)node];
      lVar14 = (long)(int)uVar9;
      uVar11 = 0;
      if (lVar14 != -1) {
        if (pRVar2->meshlink == (void *)0x0) {
          pRVar4 = ref_grid->node;
          pRVar5 = pRVar3->item;
          RVar12 = pRVar5[lVar14].ref;
          uVar17 = (ulong)uVar9;
          RVar10 = RVar12;
          while ((int)uVar17 != -1) {
            if (pRVar2->descr[RVar10 * 6] == 0) {
              uVar11 = ref_egads_eval(pRVar2,RVar10,xyz,(REF_DBL *)0x0);
              if (uVar11 == 0) {
                iVar1 = pRVar2->descr[(long)(RVar10 * 6) + 5];
                uVar20 = SUB84(xyz[0],0);
                uVar21 = (undefined4)((ulong)xyz[0] >> 0x20);
                pRVar15 = pRVar4->real;
                goto LAB_001446aa;
              }
              pcVar18 = "eval edge";
              uVar16 = 0x623;
              goto LAB_00144561;
            }
            uVar17 = (ulong)pRVar5[(int)uVar17].next;
            RVar10 = -1;
            if (uVar17 != 0xffffffffffffffff) {
              RVar10 = pRVar5[uVar17].ref;
            }
          }
          uVar17 = (ulong)uVar9;
          RVar10 = RVar12;
LAB_0014441c:
          if ((int)uVar17 == -1) {
            while( true ) {
              if ((int)lVar14 == -1) {
                return 0;
              }
              if (pRVar2->descr[RVar12 * 6] == 2) break;
              lVar14 = (long)pRVar5[(int)lVar14].next;
              RVar12 = -1;
              if (lVar14 != -1) {
                RVar12 = pRVar5[lVar14].ref;
              }
            }
            uVar11 = ref_egads_eval(pRVar2,RVar12,xyz,(REF_DBL *)0x0);
            if (uVar11 == 0) {
              iVar1 = pRVar2->descr[(long)(RVar12 * 6) + 5];
              uVar20 = SUB84(xyz[0],0);
              uVar21 = (undefined4)((ulong)xyz[0] >> 0x20);
              pRVar15 = pRVar4->real;
LAB_001446aa:
              lVar14 = (long)iVar1;
              pRVar15[lVar14 * 0xf] = (REF_DBL)CONCAT44(uVar21,uVar20);
              pRVar15[lVar14 * 0xf + 1] = xyz[1];
              pRVar15[lVar14 * 0xf + 2] = xyz[2];
              return 0;
            }
            pcVar18 = "eval face";
            uVar16 = 0x64d;
LAB_00144561:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   uVar16,"ref_geom_constrain",(ulong)uVar11,pcVar18);
            return uVar11;
          }
          uVar11 = RVar10 * 6;
          if (pRVar2->descr[(int)uVar11] != 1) {
            uVar17 = (ulong)pRVar5[(int)uVar17].next;
            RVar10 = -1;
            if (uVar17 != 0xffffffffffffffff) {
              RVar10 = pRVar5[uVar17].ref;
            }
            goto LAB_0014441c;
          }
          uVar9 = ref_egads_eval(pRVar2,RVar10,xyz,(REF_DBL *)0x0);
          if (uVar9 != 0) {
            uVar17 = (ulong)uVar9;
            pcVar18 = "eval edge";
            uVar16 = 0x637;
            goto LAB_001449be;
          }
          lVar14 = (long)pRVar2->descr[(long)(int)uVar11 + 5];
          pRVar15 = pRVar4->real;
          pRVar15[lVar14 * 0xf] = xyz[0];
          pRVar15[lVar14 * 0xf + 1] = xyz[1];
          pRVar15[lVar14 * 0xf + 2] = xyz[2];
          uVar17 = 3;
          if (((RVar10 < 0) || (pRVar2 = ref_grid->geom, pRVar2->max <= RVar10)) ||
             (pRVar6 = pRVar2->descr, pRVar6[(int)uVar11] != 1)) goto LAB_0014499d;
          pRVar3 = pRVar2->ref_adj;
          iVar1 = pRVar6[(long)(int)uVar11 + 5];
          lVar14 = (long)iVar1;
          uVar17 = 0xffffffff;
          RVar12 = -1;
          if (-1 < lVar14) {
            uVar17 = 0xffffffff;
            RVar12 = -1;
            if (iVar1 < pRVar3->nnode) {
              uVar9 = pRVar3->first[lVar14];
              uVar17 = 0xffffffff;
              RVar12 = -1;
              if ((long)(int)uVar9 != -1) {
                RVar12 = pRVar3->item[(int)uVar9].ref;
                uVar17 = (ulong)uVar9;
              }
            }
          }
          ref_cell = ref_grid->cell[3];
          t = pRVar2->param[(uint)(RVar10 * 2)];
          bVar19 = false;
          while ((int)uVar17 != -1) {
            if ((pRVar6[RVar12 * 6] == 2) && (bVar8 = !bVar19, bVar19 = true, bVar8)) {
              bVar19 = pRVar6[(long)(RVar12 * 6) + 3] != 0;
            }
            uVar17 = (ulong)pRVar3->item[(int)uVar17].next;
            RVar12 = -1;
            if (uVar17 != 0xffffffffffffffff) {
              RVar12 = pRVar3->item[uVar17].ref;
            }
          }
          if (!bVar19) {
            uVar17 = 0xffffffff;
            RVar10 = -1;
            if (-1 < iVar1) {
              uVar17 = 0xffffffff;
              RVar10 = -1;
              if (iVar1 < pRVar3->nnode) {
                uVar9 = pRVar3->first[lVar14];
                uVar17 = 0xffffffff;
                RVar10 = -1;
                if ((long)(int)uVar9 != -1) {
                  RVar10 = pRVar3->item[(int)uVar9].ref;
                  uVar17 = (ulong)uVar9;
                }
              }
            }
            do {
              if ((int)uVar17 == -1) {
                return 0;
              }
              pRVar6 = pRVar2->descr;
              if (pRVar6[RVar10 * 6] == 2) {
                uVar9 = ref_egads_edge_face_uv
                                  (pRVar2,pRVar6[uVar11 | 1],pRVar6[(int)(RVar10 * 6 | 1)],0,t,
                                   edgeuv);
                if (uVar9 != 0) {
                  uVar17 = (ulong)uVar9;
                  pcVar18 = "edge uv";
                  uVar16 = 0x3b2;
                  goto LAB_00144993;
                }
                pRVar15 = pRVar2->param;
                pRVar15[RVar10 * 2] = edgeuv[0];
                pRVar15[RVar10 * 2 + 1] = edgeuv[1];
              }
              uVar17 = (ulong)pRVar3->item[(int)uVar17].next;
              RVar10 = -1;
              if (uVar17 != 0xffffffffffffffff) {
                RVar10 = pRVar3->item[uVar17].ref;
              }
            } while( true );
          }
          uVar17 = 0xffffffff;
          RVar10 = -1;
          if (-1 < iVar1) {
            pRVar7 = ref_cell->ref_adj;
            uVar17 = 0xffffffff;
            RVar10 = -1;
            if (iVar1 < pRVar7->nnode) {
              uVar11 = pRVar7->first[lVar14];
              uVar17 = 0xffffffff;
              RVar10 = -1;
              if ((long)(int)uVar11 != -1) {
                RVar10 = pRVar7->item[(int)uVar11].ref;
                uVar17 = (ulong)uVar11;
              }
            }
          }
          while( true ) {
            if ((int)uVar17 == -1) {
              return 0;
            }
            uVar11 = ref_cell_nodes(ref_cell,RVar10,nodes);
            RVar10 = nodes[3];
            if (uVar11 != 0) break;
            uVar11 = ref_geom_cell_tuv(pRVar2,iVar1,nodes,2,uv,&local_cc);
            if (uVar11 != 0) {
              uVar17 = (ulong)uVar11;
              pcVar18 = "cell uv";
              uVar16 = 0x3a0;
              goto LAB_00144993;
            }
            if (local_cc == 1) {
              uVar13 = 0xffffffff;
              RVar12 = -1;
              if (-1 < iVar1) {
                uVar13 = 0xffffffff;
                RVar12 = -1;
                if (iVar1 < pRVar3->nnode) {
                  uVar11 = pRVar3->first[lVar14];
                  uVar13 = 0xffffffff;
                  RVar12 = -1;
                  if ((long)(int)uVar11 != -1) {
                    RVar12 = pRVar3->item[(int)uVar11].ref;
                    uVar13 = (ulong)uVar11;
                  }
                }
              }
              while ((int)uVar13 != -1) {
                if ((pRVar2->descr[RVar12 * 6] == 2) &&
                   (RVar10 == pRVar2->descr[(int)(RVar12 * 6 | 1)])) {
                  pRVar15 = pRVar2->param;
                  pRVar15[RVar12 * 2] = uv[0];
                  (pRVar15 + RVar12 * 2)[1] = uv[1];
                }
                uVar13 = (ulong)pRVar3->item[(int)uVar13].next;
                RVar12 = -1;
                if (uVar13 != 0xffffffffffffffff) {
                  RVar12 = pRVar3->item[uVar13].ref;
                }
              }
            }
            pRVar5 = ref_cell->ref_adj->item;
            uVar17 = (ulong)pRVar5[(int)uVar17].next;
            RVar10 = -1;
            if (uVar17 != 0xffffffffffffffff) {
              RVar10 = pRVar5[uVar17].ref;
            }
          }
          uVar17 = (ulong)uVar11;
          pcVar18 = "cell nodes";
          uVar16 = 0x39d;
LAB_00144993:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 uVar16,"ref_geom_eval_edge_face_uv",uVar17,pcVar18);
LAB_0014499d:
          pcVar18 = "resol edge uv";
          uVar16 = 0x63c;
LAB_001449be:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 uVar16,"ref_geom_constrain",uVar17,pcVar18);
          return (REF_STATUS)uVar17;
        }
        uVar9 = ref_meshlink_constrain(ref_grid,node);
        if (uVar9 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x614,"ref_geom_constrain",(ulong)uVar9,"meshlink");
          uVar11 = uVar9;
        }
      }
    }
  }
  return uVar11;
}

Assistant:

REF_FCN REF_STATUS ref_geom_constrain(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_ADJ ref_adj = ref_geom_adj(ref_geom);
  REF_INT item, geom;
  REF_BOOL have_geom_node;
  REF_BOOL have_geom_edge;
  REF_BOOL have_geom_face;
  REF_INT node_geom;
  REF_INT edge_geom;
  REF_INT face_geom;
  REF_DBL xyz[3];

  /* no geom, do nothing */
  if (ref_adj_empty(ref_adj, node)) return REF_SUCCESS;

  if (ref_geom_meshlinked(ref_geom)) {
    RSS(ref_meshlink_constrain(ref_grid, node), "meshlink");
    return REF_SUCCESS;
  }

  have_geom_node = REF_FALSE;
  node_geom = REF_EMPTY;
  each_ref_adj_node_item_with_ref(ref_adj, node, item, geom) {
    if (REF_GEOM_NODE == ref_geom_type(ref_geom, geom)) {
      have_geom_node = REF_TRUE;
      node_geom = geom;
      break;
    }
  }

  if (have_geom_node) { /* update T of edges? update UV of (degen) faces? */
    RSS(ref_egads_eval(ref_geom, node_geom, xyz, NULL), "eval edge");
    node = ref_geom_node(ref_geom, node_geom);
    ref_node_xyz(ref_node, 0, node) = xyz[0];
    ref_node_xyz(ref_node, 1, node) = xyz[1];
    ref_node_xyz(ref_node, 2, node) = xyz[2];
    return REF_SUCCESS;
  }

  have_geom_edge = REF_FALSE;
  edge_geom = REF_EMPTY;
  each_ref_adj_node_item_with_ref(ref_adj, node, item, geom) {
    if (REF_GEOM_EDGE == ref_geom_type(ref_geom, geom)) {
      have_geom_edge = REF_TRUE;
      edge_geom = geom;
      break;
    }
  }

  /* edge geom, evaluate edge and update face uv */
  if (have_geom_edge) {
    RSS(ref_egads_eval(ref_geom, edge_geom, xyz, NULL), "eval edge");
    node = ref_geom_node(ref_geom, edge_geom);
    ref_node_xyz(ref_node, 0, node) = xyz[0];
    ref_node_xyz(ref_node, 1, node) = xyz[1];
    ref_node_xyz(ref_node, 2, node) = xyz[2];
    RSS(ref_geom_eval_edge_face_uv(ref_grid, edge_geom), "resol edge uv");
    return REF_SUCCESS;
  }

  /* look for face geom */
  have_geom_face = REF_FALSE;
  face_geom = REF_EMPTY;
  each_ref_adj_node_item_with_ref(ref_adj, node, item, geom) {
    if (REF_GEOM_FACE == ref_geom_type(ref_geom, geom)) {
      have_geom_face = REF_TRUE;
      face_geom = geom;
      break;
    }
  }

  /* face geom, evaluate on face uv */
  if (have_geom_face) {
    RSS(ref_egads_eval(ref_geom, face_geom, xyz, NULL), "eval face");
    node = ref_geom_node(ref_geom, face_geom);
    ref_node_xyz(ref_node, 0, node) = xyz[0];
    ref_node_xyz(ref_node, 1, node) = xyz[1];
    ref_node_xyz(ref_node, 2, node) = xyz[2];
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}